

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void * stb_sparse_ptr_matrix_get(stb_spmatrix *z,void *a,void *b,int create)

{
  undefined1 *puVar1;
  uint uVar2;
  void *__s;
  uint uVar3;
  int unaff_EBX;
  stb__stb__spmatrix__hashpair *psVar5;
  void **ppvVar6;
  stb__ptrpair k;
  stb__ptrpair k_00;
  ulong uVar4;
  
  k.b = b;
  k.a = a;
  uVar2 = stb__stb__spmatrix_hash(k);
  if ((undefined1 *)b == &DAT_00000001 && (undefined1 *)a == &DAT_00000001) {
    if (z->has_empty == '\0') goto LAB_00185c80;
    ppvVar6 = &z->ev;
  }
  else if ((undefined1 *)b == &DAT_00000002 && (undefined1 *)a == &DAT_00000002) {
    if (z->has_del == '\0') {
LAB_00185c80:
      __s = (void *)0x0;
      goto LAB_00185c83;
    }
    ppvVar6 = &z->dv;
  }
  else {
    uVar3 = z->mask & uVar2;
    uVar4 = (ulong)uVar3;
    psVar5 = z->table + uVar3;
    puVar1 = (undefined1 *)(psVar5->k).a;
    if ((puVar1 == &DAT_00000001) && ((undefined1 *)(psVar5->k).b == &DAT_00000001))
    goto LAB_00185c80;
    if ((puVar1 != (undefined1 *)a) || ((psVar5->k).b != b)) {
      __s = (void *)0x0;
      do {
        uVar4 = (ulong)((int)uVar4 + ((uVar2 >> 0x13) + (uVar2 >> 6) + uVar2 | 1) & z->mask);
        psVar5 = z->table + uVar4;
        puVar1 = (undefined1 *)(psVar5->k).a;
        if ((puVar1 == &DAT_00000001) && ((undefined1 *)(psVar5->k).b == &DAT_00000001))
        goto LAB_00185c83;
      } while ((puVar1 != (undefined1 *)a) || ((psVar5->k).b != b));
    }
    ppvVar6 = &psVar5->v;
  }
  __s = *ppvVar6;
LAB_00185c83:
  if ((create != 0) && (__s == (void *)0x0)) {
    __s = malloc_base(z->arena,(long)z->val_size,STB__chunk_raw,stb_alloc_alignment);
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)z->val_size);
      k_00.b = b;
      k_00.a = a;
      stb__stb__spmatrix_addset(z,k_00,__s,0,1,unaff_EBX);
    }
  }
  return __s;
}

Assistant:

void *stb_sparse_ptr_matrix_get(stb_spmatrix *z, void *a, void *b, int create)
{
   stb__ptrpair t = { a,b };
   void *data = stb__spmatrix_get(z, t);
   if (!data && create) {
      data = stb_malloc_raw(z->arena, z->val_size);
      if (!data) return NULL;
      memset(data, 0, z->val_size);
      stb__spmatrix_add(z, t, data);
   }
   return data;
}